

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

int ulong_to_str(unsigned_long num,char *str,int strlen)

{
  undefined1 auVar1 [16];
  unsigned_long val;
  int i;
  int len;
  int strlen_local;
  char *str_local;
  unsigned_long num_local;
  int local_4;
  
  if (num == 0) {
    if (strlen < 2) {
      local_4 = -1;
    }
    else {
      *str = '0';
      str[1] = '\0';
      local_4 = 1;
    }
  }
  else {
    len = 0;
    for (val = num; val != 0; val = val / 10) {
      len = len + 1;
    }
    if (len + 1 < strlen) {
      str[len] = '\0';
      val = num;
      for (i = 1; i <= len; i = i + 1) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = val;
        str[len - i] = SUB161(auVar1 % ZEXT816(10),0) + '0';
        val = val / 10;
      }
      local_4 = len;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int ulong_to_str(unsigned long num, char *str, int strlen)
{
   int len, i;
   unsigned long val;
   
   if (num == 0) {
      if (strlen < 2)
         return -1;
      str[0] = '0';
      str[1] = '\0';
      return 1;
   }

   for (len = 0, val = num; val; val = val / 10, len++);
   if (len + 1 >= strlen)
      return -1;

   str[len] = '\0';
   val = num;
   for (i = 1; i <= len; i++) {
      str[len - i] = '0' + val % 10;
      val = val / 10;
   }
   return len;
}